

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall cmFindPackageCommand::FillPrefixesUserRegistry(cmFindPackageCommand *this)

{
  char *__s;
  size_t sVar1;
  mapped_type *outPaths;
  string dir;
  string local_40;
  
  __s = cmsys::SystemTools::GetEnv("HOME");
  if (__s != (char *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar1);
    std::__cxx11::string::append((char *)&local_40);
    std::__cxx11::string::_M_append((char *)&local_40,(ulong)(this->Name)._M_dataplus._M_p);
    outPaths = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                            &PathLabel::UserRegistry.super_PathLabel);
    LoadPackageRegistryDir(this,&local_40,outPaths);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesUserRegistry()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinUser();
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) ==
      B_OK)
    {
    std::string fname = dir;
    fname += "/cmake/packages/";
    fname += Name;
    this->LoadPackageRegistryDir(fname,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
    }
#else
  if(const char* home = cmSystemTools::GetEnv("HOME"))
    {
    std::string dir = home;
    dir += "/.cmake/packages/";
    dir += this->Name;
    this->LoadPackageRegistryDir(dir,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
    }
#endif
}